

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadIndex(CrateReader *this,Index *i)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  uint32_t value;
  ostringstream ss_e;
  Index local_1b4 [9];
  ostringstream local_190 [376];
  
  bVar1 = StreamReader::read4(this->_sr,&local_1b4[0].value);
  if (bVar1) {
    uVar2 = this->_memoryUsage + 4;
    this->_memoryUsage = uVar2;
    if (uVar2 <= (this->_config).maxMemoryBudget) {
      i->value = (uint32_t)local_1b4[0];
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadIndex");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xcd);
    ::std::operator<<(poVar3," ");
    pcVar4 = "Reached to max memory budget.";
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadIndex");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xc9);
    ::std::operator<<(poVar3," ");
    pcVar4 = "Failed to read Index";
  }
  poVar3 = ::std::operator<<((ostream *)local_190,pcVar4);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return false;
}

Assistant:

bool CrateReader::ReadIndex(crate::Index *i) {
  // string is serialized as StringIndex
  uint32_t value;
  if (!_sr->read4(&value)) {
    PUSH_ERROR("Failed to read Index");
    return false;
  }

  CHECK_MEMORY_USAGE(sizeof(uint32_t));

  (*i) = crate::Index(value);
  return true;
}